

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::UninterpretedOption_NamePart::_InternalParse
          (UninterpretedOption_NamePart *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  string *s;
  uint64 uVar2;
  uint uVar3;
  uint32 tag;
  char *local_40;
  uint local_34;
  
  uVar3 = 0;
  local_40 = ptr;
  do {
    while( true ) {
      bVar1 = internal::ParseContext::Done(ctx,&local_40);
      if (bVar1) goto LAB_002b4fdb;
      local_40 = internal::ReadTag(local_40,&local_34,0);
      if (local_40 == (char *)0x0) goto LAB_002b4fca;
      if (local_34 >> 3 == 2) break;
      if ((local_34 >> 3 == 1) && ((char)local_34 == '\n')) {
        s = _internal_mutable_name_part_abi_cxx11_(this);
        local_40 = internal::InlineGreedyStringParser(s,local_40,ctx);
      }
      else {
LAB_002b4fa0:
        if ((local_34 == 0) || ((local_34 & 7) == 4)) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_34 - 1;
          goto LAB_002b4fdb;
        }
        local_40 = internal::UnknownFieldParse(local_34,&this->_internal_metadata_,local_40,ctx);
      }
      if (local_40 == (char *)0x0) goto LAB_002b4fca;
    }
    if ((char)local_34 != '\x10') goto LAB_002b4fa0;
    uVar3 = 2;
    uVar2 = internal::ReadVarint(&local_40);
    this->is_extension_ = uVar2 != 0;
  } while (local_40 != (char *)0x0);
LAB_002b4fca:
  local_40 = (char *)0x0;
LAB_002b4fdb:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar3;
  return local_40;
}

Assistant:

const char* UninterpretedOption_NamePart::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // required string name_part = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name_part(), ptr, ctx, "google.protobuf.UninterpretedOption.NamePart.name_part");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // required bool is_extension = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_is_extension(&has_bits);
          is_extension_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}